

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_character.h
# Opt level: O0

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,date::fraction_t<unsigned_int,9u>&>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               character_t<char> *fmt,fraction_t<unsigned_int,_9U> *others)

{
  bool bVar1;
  value_type vVar2;
  char_type ch;
  fraction_t<unsigned_int,_9U> *others_local;
  character_t<char> *fmt_local;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end_local;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos_local;
  
  bVar1 = iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator==
                    (pos,end);
  if (bVar1) {
    pos_local._7_1_ = false;
  }
  else {
    vVar2 = iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator*(pos)
    ;
    if (vVar2 == fmt->value) {
      iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++(pos);
      pos_local._7_1_ =
           read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,unsigned_int,9u>
                     (pos,end,others);
    }
    else {
      pos_local._7_1_ = false;
    }
  }
  return pos_local._7_1_;
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, const character_t<Char>& fmt, Others&&... others)
{
    using char_type = typename iterator_traits<Iterator>::value_type;

    if (pos == end)
        return false;

    const char_type ch = *pos;
    if (ch != fmt.value)
        return false;

    ++pos;
    return read_impl(pos, end, std::forward<Others>(others)...);
}